

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O1

REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid)

{
  REF_NODE ref_node;
  REF_CELL pRVar1;
  REF_INT *pRVar2;
  REF_STATUS RVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  REF_INT cell;
  int iVar8;
  REF_BOOL valid;
  REF_INT nodes [27];
  int local_b4;
  REF_GRID local_b0;
  REF_INT local_a8 [30];
  
  ref_node = ref_grid->node;
  pRVar1 = ref_grid->cell[3];
  local_b0 = ref_grid;
  if (0 < pRVar1->max) {
    cell = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,cell,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_b4);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x30f,"ref_grid_orient_twod",(ulong)uVar4,"valid");
          return uVar4;
        }
        if ((local_b4 == 0) && (iVar8 = pRVar1->node_per, 0 < iVar8)) {
          pRVar2 = pRVar1->c2n;
          iVar5 = -1;
          lVar7 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)cell + lVar7] = local_a8[iVar8 + iVar5];
            iVar8 = pRVar1->node_per;
            lVar7 = lVar7 + 1;
            iVar5 = iVar5 + -1;
          } while ((int)lVar7 < iVar8);
        }
      }
      cell = cell + 1;
    } while (cell < pRVar1->max);
  }
  pRVar1 = local_b0->cell[6];
  if (0 < pRVar1->max) {
    iVar8 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,iVar8,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_node_tri_twod_orientation(ref_node,local_a8,&local_b4);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x31a,"ref_grid_orient_twod",(ulong)uVar4,"valid");
          return uVar4;
        }
        if ((local_b4 == 0) && (iVar5 = pRVar1->node_per, 0 < iVar5)) {
          pRVar2 = pRVar1->c2n;
          iVar6 = -1;
          lVar7 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)iVar8 + lVar7] = local_a8[iVar5 + iVar6];
            iVar5 = pRVar1->node_per;
            lVar7 = lVar7 + 1;
            iVar6 = iVar6 + -1;
          } while ((int)lVar7 < iVar5);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < pRVar1->max);
  }
  pRVar1 = local_b0->cell[0];
  if (0 < pRVar1->max) {
    iVar8 = 0;
    do {
      RVar3 = ref_cell_nodes(pRVar1,iVar8,local_a8);
      if (RVar3 == 0) {
        uVar4 = ref_grid_orient_edg(local_b0,local_a8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x325,"ref_grid_orient_twod",(ulong)uVar4,"orient_edge");
          return uVar4;
        }
        if (0 < pRVar1->node_per) {
          pRVar2 = pRVar1->c2n;
          lVar7 = 0;
          do {
            pRVar2[(long)pRVar1->size_per * (long)iVar8 + lVar7] = local_a8[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 < pRVar1->node_per);
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < pRVar1->max);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_grid_orient_twod(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL valid;
  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    /* uses tri formed from first three nodes of quad for orientation */
    RSS(ref_node_tri_twod_orientation(ref_node, nodes, &valid), "valid");
    if (!valid) {
      each_ref_cell_cell_node(ref_cell, cell_node) {
        ref_cell_c2n(ref_cell, cell_node, cell) =
            nodes[ref_cell_node_per(ref_cell) - 1 - cell_node];
      }
    }
  }
  /* orient edge after tri and quad sorted to use them as reference */
  ref_cell = ref_grid_edg(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_grid_orient_edg(ref_grid, nodes), "orient_edge");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      ref_cell_c2n(ref_cell, cell_node, cell) = nodes[cell_node];
    }
  }
  return REF_SUCCESS;
}